

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&>::MatchAndExplain
          (ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&> *this,
          array<unsigned_long,_5UL> *container,MatchResultListener *listener)

{
  unsigned_long *x;
  ostream *poVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  pointer pMVar4;
  MatchResultListener *pMVar5;
  pointer pMVar6;
  size_t sVar7;
  ulong uVar8;
  size_t count;
  long lVar9;
  long lVar10;
  size_t sVar11;
  undefined1 local_238 [8];
  StringMatchResultListener s;
  long local_90 [2];
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  long local_40;
  
  poVar1 = listener->stream_;
  explanations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)container;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_80,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_238);
  uVar8 = 0x20;
  lVar10 = 0;
  lVar9 = 0;
  local_40 = 0;
  sVar7 = 0;
  do {
    pMVar4 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar11 = ((long)(this->matchers_).
                    super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
             -0x5555555555555555;
    if (sVar7 == sVar11) {
LAB_0016b99f:
      count = (uVar8 >> 3) + 1 + sVar7;
      if (local_40 == 0x28) {
        count = sVar7;
      }
      pMVar4 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar6 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (count != ((long)pMVar6 - (long)pMVar4 >> 3) * -0x5555555555555555) goto LAB_0016bb69;
      if (sVar7 == sVar11) goto LAB_0016baa1;
      if (poVar1 == (ostream *)0x0) goto LAB_0016bbbb;
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar5->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
      }
      MatchResultListener::operator<<(pMVar5,(char (*) [15])" doesn\'t match");
      poVar1 = listener->stream_;
      bVar3 = false;
      if ((poVar1 == (ostream *)0x0) || (*(long *)((long)((long)local_80 + 8) + local_40 * 4) == 0))
      goto LAB_0016bbbe;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,*(char **)((long)&((_Alloc_hider *)local_80)->_M_p + local_40 * 4),
                 *(long *)((long)((long)local_80 + 8) + local_40 * 4));
      goto LAB_0016bbbb;
    }
    x = (unsigned_long *)
        ((long)&((explanations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus)._M_p + local_40)
    ;
    if (poVar1 == (ostream *)0x0) {
      s.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)0x0;
      local_238 = (undefined1  [8])&PTR__MatchResultListener_001fea88;
      bVar3 = MatcherBase<const_unsigned_long_&>::MatchAndExplain
                        ((MatcherBase<const_unsigned_long_&> *)
                         ((long)&(pMVar4->super_MatcherBase<const_unsigned_long_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         lVar9),x,(MatchResultListener *)local_238);
    }
    else {
      s.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)&s.field_0x18;
      local_238 = (undefined1  [8])&PTR__StringMatchResultListener_001feb90;
      std::__cxx11::stringstream::stringstream((stringstream *)&s.super_MatchResultListener.stream_)
      ;
      bVar3 = MatcherBase<const_unsigned_long_&>::MatchAndExplain
                        ((MatcherBase<const_unsigned_long_&> *)
                         ((long)&(((this->matchers_).
                                   super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_MatcherBase<const_unsigned_long_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         lVar9),x,(MatchResultListener *)local_238);
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((_Alloc_hider *)local_80)->_M_p + lVar10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s.field_0x190
                );
      if ((long *)s._400_8_ != local_90) {
        operator_delete((void *)s._400_8_,local_90[0] + 1);
      }
      local_238 = (undefined1  [8])&PTR__StringMatchResultListener_001feb90;
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)&s.super_MatchResultListener.stream_);
      std::ios_base::~ios_base((ios_base *)&s.field_0x88);
    }
    if (!bVar3) goto LAB_0016b99f;
    local_40 = local_40 + 8;
    sVar7 = sVar7 + 1;
    uVar8 = uVar8 - 8;
    lVar9 = lVar9 + 0x18;
    lVar10 = lVar10 + 0x20;
  } while (local_40 != 0x28);
  pMVar4 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  count = 5;
  if ((long)pMVar6 - (long)pMVar4 == 0x78) {
LAB_0016baa1:
    bVar3 = true;
    if (pMVar6 != pMVar4 && poVar1 != (ostream *)0x0) {
      lVar9 = 8;
      bVar3 = false;
      lVar10 = 0;
      do {
        auVar2 = local_80;
        if (*(long *)((long)&((_Alloc_hider *)local_80)->_M_p + lVar9) != 0) {
          if (bVar3) {
            MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
          }
          pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
          if (pMVar5->stream_ != (ostream *)0x0) {
            std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
          }
          pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
          bVar3 = true;
          if (pMVar5->stream_ != (ostream *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (pMVar5->stream_,*(char **)((long)auVar2 + lVar9 + -8),
                       *(long *)((long)&((_Alloc_hider *)auVar2)->_M_p + lVar9));
          }
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x20;
      } while (lVar10 != ((long)(this->matchers_).
                                super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->matchers_).
                                super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555);
      bVar3 = true;
    }
  }
  else {
LAB_0016bb69:
    bVar3 = false;
    if ((poVar1 != (ostream *)0x0) && (count != 0)) {
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
      Elements((ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&> *)local_238,count);
      MatchResultListener::operator<<(pMVar5,(Message *)local_238);
      if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_238 !=
          (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(_func_int **)local_238 + 8))();
      }
LAB_0016bbbb:
      bVar3 = false;
    }
  }
LAB_0016bbbe:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  return bVar3;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }